

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_get_file_info(fdb_file_handle *fhandle,fdb_file_info *info)

{
  wal_shard *pwVar1;
  fdb_file_handle *fhandle_00;
  size_t sVar2;
  long lVar3;
  uint64_t uVar4;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  size_t num;
  kvs_header *kv_header;
  size_t wal_n_inserts;
  size_t wal_deletes;
  size_t wal_docs;
  fdb_kvs_handle *handle;
  uint64_t ndeletes;
  uint64_t ndocs;
  fdb_kvs_handle *in_stack_00000058;
  filemgr *pfVar5;
  kvs_stat_attr_t attr;
  fdb_status local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (undefined8 *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    pfVar5 = (filemgr *)*in_RDI;
    fdb_check_file_reopen((fdb_kvs_handle *)pfVar5,(file_status_t *)0x0);
    fdb_sync_db_header(in_stack_00000058);
    if (((fdb_config *)&(pfVar5->header).op_stat)->compaction_mode == '\x01') {
      *in_RSI = (pfVar5->plock).inactive.tail;
    }
    else {
      *in_RSI = ((filemgr *)pfVar5->wal)->filename;
    }
    if ((snap_handle *)(pfVar5->plock).active.head == (snap_handle *)0x0) {
      in_RSI[1] = 0;
    }
    fhandle_00 = (fdb_file_handle *)wal_get_num_docs((filemgr *)0x162a84);
    sVar2 = wal_get_num_deletes((filemgr *)0x162a97);
    lVar3 = (long)fhandle_00 - sVar2;
    uVar4 = _kvs_stat_get_sum(pfVar5,(kvs_stat_attr_t)((ulong)fhandle_00 >> 0x20));
    if (uVar4 + lVar3 < sVar2) {
      in_RSI[2] = 0;
    }
    else if (uVar4 == 0) {
      in_RSI[2] = lVar3;
    }
    else {
      in_RSI[2] = (uVar4 + lVar3) - sVar2;
    }
    uVar4 = _kvs_stat_get_sum(pfVar5,(kvs_stat_attr_t)((ulong)fhandle_00 >> 0x20));
    if (uVar4 == 0) {
      in_RSI[3] = sVar2;
    }
    else {
      in_RSI[3] = uVar4 + sVar2;
    }
    sVar2 = fdb_estimate_space_used(fhandle_00);
    attr = (kvs_stat_attr_t)((ulong)fhandle_00 >> 0x20);
    in_RSI[4] = sVar2;
    uVar4 = filemgr_get_pos((filemgr *)0x162b7c);
    in_RSI[5] = uVar4;
    uVar4 = _kvs_stat_get_sum(pfVar5,attr);
    in_RSI[8] = uVar4;
    pwVar1 = pfVar5->wal[3].key_shards;
    pfVar5 = (filemgr *)0x1;
    if (pwVar1 != (wal_shard *)0x0) {
      pthread_spin_lock((pthread_spinlock_t *)&pwVar1[2]._map.aux);
      pfVar5 = (filemgr *)((long)&pfVar5->filename + (long)pwVar1[2]._map.root);
      pthread_spin_unlock((pthread_spinlock_t *)&pwVar1[2]._map.aux);
    }
    in_RSI[6] = pfVar5;
    uVar4 = sb_get_bmp_revnum(pfVar5);
    in_RSI[7] = uVar4;
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_file_info(fdb_file_handle *fhandle, fdb_file_info *info)
{
    uint64_t ndocs, ndeletes;
    fdb_kvs_handle *handle;

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!info) {
        return FDB_RESULT_INVALID_ARGS;
    }
    handle = fhandle->root;

    fdb_check_file_reopen(handle, NULL);
    fdb_sync_db_header(handle);

    if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
        // compaction daemon mode
        info->filename = handle->filename;
    } else {
        info->filename = handle->file->filename;
    }

    if (handle->shandle) {
        // handle for snapshot
    } else {
        info->new_filename = NULL;
    }

    // Note that doc_count includes the number of WAL entries, which might
    // incur an incorrect estimation. However, after the WAL flush, the doc
    // counter becomes consistent. We plan to devise a new way of tracking
    // the number of docs in a database instance.
    size_t wal_docs = wal_get_num_docs(handle->file);
    size_t wal_deletes = wal_get_num_deletes(handle->file);
    size_t wal_n_inserts = wal_docs - wal_deletes;

    ndocs = _kvs_stat_get_sum(handle->file, KVS_STAT_NDOCS);

    if (ndocs + wal_n_inserts < wal_deletes) {
        info->doc_count = 0;
    } else {
        if (ndocs) {
            info->doc_count = ndocs + wal_n_inserts - wal_deletes;
        } else {
            info->doc_count = wal_n_inserts;
        }
    }

    ndeletes = _kvs_stat_get_sum(handle->file, KVS_STAT_NDELETES);
    if (ndeletes) { // not accurate since some ndeletes may be wal_deletes
        info->deleted_count = ndeletes + wal_deletes;
    } else { // this is accurate since it reflects only wal_ndeletes
        info->deleted_count = wal_deletes;
    }

    info->space_used = fdb_estimate_space_used(fhandle);
    info->file_size = filemgr_get_pos(handle->file);
    info->num_live_nodes = _kvs_stat_get_sum(handle->file, KVS_STAT_NLIVENODES);

    // Get the number of KV store instances in a given ForestDB file.
    struct kvs_header *kv_header = handle->file->kv_header;
    size_t num = 1; // default KV store.
    if (kv_header) {
        spin_lock(&kv_header->lock);
        num += kv_header->num_kv_stores;
        spin_unlock(&kv_header->lock);
    }
    info->num_kv_stores = num;

    info->sb_bmp_revnum = sb_get_bmp_revnum(handle->file);

    return FDB_RESULT_SUCCESS;
}